

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

bool __thiscall AggressiveBotStrategy::canAttack(AggressiveBotStrategy *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar4;
  Country *pCVar5;
  pointer ppCVar6;
  _Base_ptr p_Var7;
  pointer ppCVar8;
  bool bVar9;
  byte bVar10;
  pointer ppCVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  Country *pCVar15;
  Country *pCVar16;
  _Base_ptr p_Var17;
  int local_6c;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_68;
  byte bVar11;
  
  p_Var1 = &local_68._M_impl.super__Rb_tree_header;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  pCVar15 = (Country *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar11 = 0;
  bVar10 = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    pvVar4 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
    for (ppCVar8 = (pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppCVar8 !=
        (pvVar4->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
      pCVar5 = *ppCVar8;
      pCVar16 = pCVar5;
      if (pCVar15 != (Country *)0x0) {
        pCVar16 = pCVar15;
        if (*pCVar15->pNumberOfTroops < *pCVar5->pNumberOfTroops) {
LAB_00119c13:
          ppCVar12 = (pCVar5->pAdjCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          ppCVar6 = (pCVar5->pAdjCountries->
                    super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar12 != ppCVar6) {
            do {
              if (*(*ppCVar12)->pPlayerOwnerId != *pCVar5->pPlayerOwnerId) {
                pCVar15 = pCVar5;
              }
              ppCVar12 = ppCVar12 + 1;
              pCVar16 = pCVar15;
            } while (ppCVar12 != ppCVar6);
          }
        }
        else if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          iVar2 = *pCVar15->cyID;
          p_Var7 = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var14 = &p_Var1->_M_header;
          do {
            p_Var13 = p_Var14;
            p_Var17 = p_Var7;
            _Var3 = p_Var17[1]._M_color;
            p_Var14 = p_Var17;
            if ((int)_Var3 < iVar2) {
              p_Var14 = p_Var13;
            }
            p_Var7 = (&p_Var17->_M_left)[(int)_Var3 < iVar2];
          } while ((&p_Var17->_M_left)[(int)_Var3 < iVar2] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var14 != p_Var1) {
            if ((int)_Var3 < iVar2) {
              p_Var17 = p_Var13;
            }
            if ((int)p_Var17[1]._M_color <= iVar2) goto LAB_00119c13;
          }
        }
      }
      pCVar15 = pCVar16;
    }
    ppCVar8 = (pCVar15->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar12 = (pCVar15->pAdjCountries->
               super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppCVar8 != ppCVar12) {
      bVar10 = bVar11;
      do {
        if (*(*ppCVar8)->pPlayerOwnerId != *pCVar15->pPlayerOwnerId) {
          bVar10 = 1;
        }
        ppCVar8 = ppCVar8 + 1;
        bVar11 = bVar10;
      } while (ppCVar8 != ppCVar12);
    }
    if (bVar10 != 0) {
      pCVar5 = (this->super_PlayerStrategy).from;
      if (pCVar5 == (Country *)0x0) {
        bVar9 = true;
      }
      else {
        bVar9 = (bool)(*pCVar15->cyID == *pCVar5->cyID & bVar10);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_68);
      return bVar9;
    }
    local_6c = *pCVar15->cyID;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_68,&local_6c);
  } while( true );
}

Assistant:

bool AggressiveBotStrategy::canAttack() {
    Map::Country* biggest = nullptr;
    bool canAttack = false;
    std::set<int> checkedCountries = std::set<int>();

    while(!canAttack) {
        for (auto* country : *player->getOwnedCountries()) {
            if (biggest == nullptr) {
                biggest = country;
            } else if (biggest->getNumberOfTroops() < country->getNumberOfTroops() ||
                       checkedCountries.find(biggest->getCountryId()) != checkedCountries.end()) {
                for (auto* neighbour : *country->getAdjCountries()) {
                    if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                        biggest = country;
                    }
                }
            }
        }

        for (auto* neighbour: *biggest->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() != biggest->getPlayerOwnerID()) {
                canAttack = true;
            }
        }
        if (!canAttack) {
            checkedCountries.insert(biggest->getCountryId());
        }
    }

    if (from != nullptr && biggest->getCountryId() != from->getCountryId()) {
        canAttack = false;
    }
    return canAttack;
}